

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void test_real(void)

{
  undefined8 uVar1;
  double lhs [1];
  double colentries2 [1];
  double colentries1 [1];
  double obj [2];
  double rowentries1 [2];
  double primal [2];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = SoPlex_create();
  local_90 = 0xbff0000000000000;
  local_98 = 0x3ff0000000000000;
  local_a0 = 0xc024000000000000;
  local_48 = 0;
  uStack_40 = 0;
  SoPlex_setIntParam(uVar1,0,0xffffffff);
  SoPlex_addColReal(0,0,0x444b1ae4d6e2ef50,uVar1,&local_90,1,1);
  SoPlex_addColReal(0,0xc44b1ae4d6e2ef50,0x444b1ae4d6e2ef50,uVar1,&local_98,1,1);
  SoPlex_changeLhsReal(uVar1,&local_a0,1);
  SoPlex_optimize(uVar1);
  SoPlex_getPrimalReal(uVar1,&local_48,2);
  SoPlex_free(uVar1);
  uVar1 = SoPlex_create();
  local_58 = 0xbff0000000000000;
  uStack_50 = 0x3ff0000000000000;
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0xd6e2ef50;
  uStack_5c = 0xc44b1ae4;
  local_78 = 0x444b1ae4d6e2ef50;
  uStack_70 = 0x444b1ae4d6e2ef50;
  local_88 = 0;
  uStack_84 = 0x3ff00000;
  uStack_80 = 0;
  uStack_7c = 0x3ff00000;
  SoPlex_setIntParam(uVar1,0,0xffffffff);
  SoPlex_addRowReal(0,0x444b1ae4d6e2ef50,uVar1,&local_58,2,2);
  SoPlex_changeBoundsReal(uVar1,&local_68,&local_78,2);
  SoPlex_changeObjReal(uVar1,&local_88,2);
  SoPlex_optimize(uVar1);
  SoPlex_getPrimalReal(uVar1,&local_48,2);
  SoPlex_free(uVar1);
  return;
}

Assistant:

void test_real(void)
{
   /* create LP via columns */

   void *soplex = SoPlex_create();
   double infty = 10e+20;
   double colentries1[] = {-1.0};
   double colentries2[] = {1.0};
   double lhs[] = {-10.0};
   double primal[] = {0.0,0.0};

   /* minimize */
   SoPlex_setIntParam(soplex, 0, -1);

   /* add columns */
   SoPlex_addColReal(soplex, colentries1, 1, 1, 1.0, 0.0, infty);
   SoPlex_addColReal(soplex, colentries2, 1, 1, 1.0, -infty, infty);
   assert(SoPlex_numRows(soplex) == 1);
   assert(SoPlex_numCols(soplex) == 2);

   /* set lhs of constraint */
   SoPlex_changeLhsReal(soplex, lhs, 1);

   /* optimize and get solution and objective value */
   int result = SoPlex_optimize(soplex);
   assert(result == 1);
   UNUSED(result); /* add this to avoid unused variable warining */
   SoPlex_getPrimalReal(soplex, primal, 2);
   assert(primal[0] == 0.0 && primal[1] == -10.0);
   assert(SoPlex_objValueReal(soplex) == -10.0);

	SoPlex_free(soplex);

   /* create LP via rows */

   void *soplex2 = SoPlex_create();
   double rowentries1[] = {-1.0, 1.0};
   double lb[] = {0.0, -infty};
   double ub[] = {infty, infty};
   double obj[] = {1.0, 1.0};

   /* minimize */
   SoPlex_setIntParam(soplex2, 0, -1);

   /* add row */
   SoPlex_addRowReal(soplex2, rowentries1, 2, 2, -10.0, infty);

   /* add variable bounds */
   SoPlex_changeBoundsReal(soplex2, lb, ub, 2);
   assert(SoPlex_numRows(soplex2) == 1);
   assert(SoPlex_numCols(soplex2) == 2);

   /* add objective */
   SoPlex_changeObjReal(soplex2, obj, 2);

   /* optimize and get solution and objective value */
   result = SoPlex_optimize(soplex2);
   assert(result == 1);
   SoPlex_getPrimalReal(soplex2, primal, 2);
   assert(primal[0] == 0.0 && primal[1] == -10.0);
   assert(SoPlex_objValueReal(soplex2) == -10.0);

	SoPlex_free(soplex2);
}